

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

HeapType __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,HeapType type)

{
  uintptr_t uVar1;
  HeapType HVar2;
  value_type *pvVar3;
  byte extraout_DL;
  undefined1 auStack_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> supers;
  value_type local_28;
  HeapType type_local;
  
  auStack_48 = (undefined1  [8])0x0;
  supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HVar2.id = type.id;
  do {
    local_28.id = HVar2.id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,&local_28);
    HVar2.id = wasm::HeapType::getSuperType();
  } while ((extraout_DL & 1) != 0);
  pvVar3 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (&this->random,
                      (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
  uVar1 = pvVar3->id;
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
  return (HeapType)uVar1;
}

Assistant:

HeapType TranslateToFuzzReader::getSuperType(HeapType type) {
  // TODO cache these?
  std::vector<HeapType> supers;
  while (1) {
    supers.push_back(type);
    if (auto super = type.getSuperType()) {
      type = *super;
    } else {
      break;
    }
  }
  return pick(supers);
}